

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddArchitectureFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  char cVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  iterator i;
  pointer pbVar7;
  allocator local_e1;
  char *local_e0;
  string deploymentTargetFlagVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string sysrootFlagVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archs;
  
  pcVar2 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&sysrootFlagVar,"APPLE",(allocator *)&deploymentTargetFlagVar);
  bVar3 = cmMakefile::IsOn(pcVar2,&sysrootFlagVar);
  std::__cxx11::string::~string((string *)&sysrootFlagVar);
  if ((bVar3) && (this->EmitUniversalBinaryFlags == true)) {
    archs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    archs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    archs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetAppleArchs(target,config,&archs);
    pcVar2 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&sysrootFlagVar,"CMAKE_OSX_SYSROOT",(allocator *)&deploymentTargetFlagVar);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&sysrootFlagVar);
    std::__cxx11::string::~string((string *)&sysrootFlagVar);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else if ((*pcVar4 == '/') && (pcVar4[1] == '\0')) {
      pcVar4 = (char *)0x0;
    }
    std::__cxx11::string::string((string *)&local_b8,"CMAKE_",(allocator *)&local_78);
    std::operator+(&deploymentTargetFlagVar,&local_b8,lang);
    std::operator+(&sysrootFlagVar,&deploymentTargetFlagVar,"_SYSROOT_FLAG");
    std::__cxx11::string::~string((string *)&deploymentTargetFlagVar);
    std::__cxx11::string::~string((string *)&local_b8);
    local_e0 = cmMakefile::GetDefinition(this->Makefile,&sysrootFlagVar);
    pcVar2 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&deploymentTargetFlagVar,"CMAKE_OSX_DEPLOYMENT_TARGET",
               (allocator *)&local_b8);
    pcVar5 = cmMakefile::GetDefinition(pcVar2,&deploymentTargetFlagVar);
    std::__cxx11::string::~string((string *)&deploymentTargetFlagVar);
    std::__cxx11::string::string((string *)&local_78,"CMAKE_",&local_e1);
    std::operator+(&local_b8,&local_78,lang);
    std::operator+(&deploymentTargetFlagVar,&local_b8,"_OSX_DEPLOYMENT_TARGET_FLAG");
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    pcVar6 = cmMakefile::GetDefinition(this->Makefile,&deploymentTargetFlagVar);
    if (((archs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          archs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) && (lang->_M_string_length != 0)) &&
       ((cVar1 = *(lang->_M_dataplus)._M_p,
        pbVar7 = archs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, cVar1 == 'F' || (cVar1 == 'C')))) {
      for (; pbVar7 != archs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((string *)flags);
      }
    }
    if ((((local_e0 != (char *)0x0) && (*local_e0 != '\0')) && (pcVar4 != (char *)0x0)) &&
       (*pcVar4 != '\0')) {
      std::__cxx11::string::append((char *)flags);
      std::__cxx11::string::append((char *)flags);
      std::__cxx11::string::append((char *)flags);
      std::__cxx11::string::string((string *)&local_78,pcVar4,&local_e1);
      cmOutputConverter::Convert(&local_b8,&this->super_cmOutputConverter,&local_78,NONE,SHELL);
      std::__cxx11::string::append((string *)flags);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_78);
    }
    if (((pcVar6 != (char *)0x0) && (pcVar5 != (char *)0x0)) &&
       ((*pcVar6 != '\0' && (*pcVar5 != '\0')))) {
      std::__cxx11::string::append((char *)flags);
      std::__cxx11::string::append((char *)flags);
      std::__cxx11::string::append((char *)flags);
    }
    std::__cxx11::string::~string((string *)&deploymentTargetFlagVar);
    std::__cxx11::string::~string((string *)&sysrootFlagVar);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&archs);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddArchitectureFlags(std::string& flags,
                                            cmGeneratorTarget const* target,
                                            const std::string& lang,
                                            const std::string& config)
{
  // Only add Mac OS X specific flags on Darwin platforms (OSX and iphone):
  if(!this->Makefile->IsOn("APPLE"))
    {
    return;
    }

  if(this->EmitUniversalBinaryFlags)
    {
    std::vector<std::string> archs;
    target->GetAppleArchs(config, archs);
    const char* sysroot = this->Makefile->GetDefinition("CMAKE_OSX_SYSROOT");
    if(sysroot && sysroot[0] == '/' && !sysroot[1])
      { sysroot = 0; }
    std::string sysrootFlagVar =
      std::string("CMAKE_") + lang + "_SYSROOT_FLAG";
    const char* sysrootFlag =
      this->Makefile->GetDefinition(sysrootFlagVar);
    const char* deploymentTarget =
      this->Makefile->GetDefinition("CMAKE_OSX_DEPLOYMENT_TARGET");
    std::string deploymentTargetFlagVar =
      std::string("CMAKE_") + lang + "_OSX_DEPLOYMENT_TARGET_FLAG";
    const char* deploymentTargetFlag =
      this->Makefile->GetDefinition(deploymentTargetFlagVar);
    if(!archs.empty() && !lang.empty() && (lang[0] =='C' || lang[0] == 'F'))
      {
      for(std::vector<std::string>::iterator i = archs.begin();
          i != archs.end(); ++i)
        {
        flags += " -arch ";
        flags += *i;
        }
      }

    if(sysrootFlag && *sysrootFlag && sysroot && *sysroot)
      {
      flags += " ";
      flags += sysrootFlag;
      flags += " ";
      flags += this->Convert(sysroot, NONE, SHELL);
      }

    if (deploymentTargetFlag && *deploymentTargetFlag &&
        deploymentTarget && *deploymentTarget)
      {
      flags += " ";
      flags += deploymentTargetFlag;
      flags += deploymentTarget;
      }
    }
}